

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_utils.h
# Opt level: O2

int timeval_subtract(timeval *result,timeval *x,timeval *y)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = timeval_comp(x,y);
  if (iVar1 < 1) {
    result->tv_sec = 0;
    result->tv_usec = 0;
    iVar1 = 1;
  }
  else {
    lVar3 = x->tv_usec;
    lVar2 = y->tv_sec;
    lVar4 = y->tv_usec;
    if (lVar4 - lVar3 != 0 && lVar3 <= lVar4) {
      iVar1 = (int)((lVar4 - lVar3) / 1000000) + 1;
      lVar4 = lVar4 - iVar1 * 1000000;
      y->tv_usec = lVar4;
      lVar2 = lVar2 + iVar1;
      y->tv_sec = lVar2;
      lVar3 = x->tv_usec;
    }
    result->tv_sec = x->tv_sec - lVar2;
    result->tv_usec = lVar3 - lVar4;
    timeval_align(result);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

inline static int timeval_subtract(struct timeval *result, struct timeval *x,
                                   struct timeval *y) {
    int ret = timeval_comp(x, y);

    if (ret <= 0) {
        result->tv_sec = 0;
        result->tv_usec = 0;
        return 1;
    }

    // in case that tv_usec is unsigned -> perform the carry
    if (x->tv_usec < y->tv_usec) {
        int nsec = (y->tv_usec - x->tv_usec) / 1000000 + 1;
        y->tv_usec -= 1000000 * nsec;
        y->tv_sec += nsec;
    }

    /* Compute the time remaining to wait.
       tv_usec is certainly positive. */
    result->tv_sec = x->tv_sec - y->tv_sec;
    result->tv_usec = x->tv_usec - y->tv_usec;
    timeval_align(result);

    /* Return 1 if result is negative. */
    return ret <= 0;
}